

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerMiscSystemFuncs(Builtins *this)

{
  Builtins *in_RDI;
  shared_ptr<slang::ast::builtins::ClassRandomizeFunction> *in_stack_fffffffffffffdc8;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffdd0;
  shared_ptr<slang::ast::SystemSubroutine> *psVar1;
  bool *in_stack_fffffffffffffdf0;
  bool *__args_1;
  KnownSystemName *in_stack_fffffffffffffdf8;
  KnownSystemName *__args;
  shared_ptr<slang::ast::SystemSubroutine> *method;
  SymbolKind typeKind;
  Builtins *this_00;
  shared_ptr<slang::ast::SystemSubroutine> local_180 [2];
  undefined1 local_15d;
  undefined4 local_15c;
  bool local_138 [16];
  KnownSystemName local_128 [4];
  undefined1 local_115;
  undefined4 local_114;
  undefined1 local_ed;
  undefined4 local_ec;
  undefined1 local_c5;
  undefined4 local_c4;
  undefined1 local_9d;
  undefined4 local_9c;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [72];
  
  psVar1 = (shared_ptr<slang::ast::SystemSubroutine> *)(local_48 + 0x20);
  std::make_shared<slang::ast::builtins::ValuePlusArgsFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ValuePlusArgsFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::ValuePlusArgsFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec535);
  std::shared_ptr<slang::ast::builtins::ValuePlusArgsFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ValuePlusArgsFunction> *)0xaec542);
  typeKind = (SymbolKind)((ulong)local_58 >> 0x20);
  std::make_shared<slang::ast::builtins::ScopeRandomizeFunction>();
  this_00 = (Builtins *)local_48;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ScopeRandomizeFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::ScopeRandomizeFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec598);
  std::shared_ptr<slang::ast::builtins::ScopeRandomizeFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ScopeRandomizeFunction> *)0xaec5a5);
  std::make_shared<slang::ast::builtins::GlobalClockFunction>();
  method = &local_68;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::GlobalClockFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::GlobalClockFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec5f5);
  std::shared_ptr<slang::ast::builtins::GlobalClockFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::GlobalClockFunction> *)0xaec602);
  local_9c = 0x39;
  local_9d = 0;
  std::make_shared<slang::ast::builtins::SFormatFunction,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SFormatFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::SFormatFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec66f);
  std::shared_ptr<slang::ast::builtins::SFormatFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SFormatFunction> *)0xaec67c);
  local_c4 = 0x3a;
  local_c5 = 1;
  std::make_shared<slang::ast::builtins::SFormatFunction,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SFormatFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::SFormatFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec6e9);
  std::shared_ptr<slang::ast::builtins::SFormatFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SFormatFunction> *)0xaec6f6);
  local_ec = 0x3b;
  local_ed = 1;
  std::make_shared<slang::ast::builtins::InferredValueFunction,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::InferredValueFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::InferredValueFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec763);
  std::shared_ptr<slang::ast::builtins::InferredValueFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::InferredValueFunction> *)0xaec770);
  local_114 = 0x3c;
  local_115 = 0;
  std::make_shared<slang::ast::builtins::InferredValueFunction,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::InferredValueFunction,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::InferredValueFunction> *)in_stack_fffffffffffffdc8);
  addSystemSubroutine(in_RDI,psVar1);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec7dd);
  std::shared_ptr<slang::ast::builtins::InferredValueFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::InferredValueFunction> *)0xaec7ea);
  __args_1 = local_138;
  std::make_shared<slang::ast::builtins::ClassRandomizeFunction>();
  __args = local_128;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ClassRandomizeFunction,void>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  addSystemMethod(this_00,typeKind,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec839);
  std::shared_ptr<slang::ast::builtins::ClassRandomizeFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ClassRandomizeFunction> *)0xaec846);
  local_15c = 0x3e;
  local_15d = 0;
  std::make_shared<slang::ast::builtins::SequenceMethod,slang::parsing::KnownSystemName,bool>
            (__args,__args_1);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SequenceMethod,void>
            (in_stack_fffffffffffffdd0,
             (shared_ptr<slang::ast::builtins::SequenceMethod> *)in_stack_fffffffffffffdc8);
  addSystemMethod(this_00,typeKind,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec8b8);
  std::shared_ptr<slang::ast::builtins::SequenceMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SequenceMethod> *)0xaec8c5);
  psVar1 = local_180;
  std::make_shared<slang::ast::builtins::SequenceMethod,slang::parsing::KnownSystemName,bool>
            (__args,__args_1);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SequenceMethod,void>
            (psVar1,(shared_ptr<slang::ast::builtins::SequenceMethod> *)in_stack_fffffffffffffdc8);
  addSystemMethod(this_00,typeKind,method);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0xaec937);
  std::shared_ptr<slang::ast::builtins::SequenceMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SequenceMethod> *)0xaec944);
  return;
}

Assistant:

void Builtins::registerMiscSystemFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name) addSystemSubroutine(std::make_shared<name##Function>())
    REGISTER(ValuePlusArgs);
    REGISTER(ScopeRandomize);
    REGISTER(GlobalClock);
#undef REGISTER

    addSystemSubroutine(std::make_shared<SFormatFunction>(KnownSystemName::SFormatF, false));
    addSystemSubroutine(std::make_shared<SFormatFunction>(KnownSystemName::PSPrintF, true));

    addSystemSubroutine(
        std::make_shared<InferredValueFunction>(KnownSystemName::InferredClock, true));
    addSystemSubroutine(
        std::make_shared<InferredValueFunction>(KnownSystemName::InferredDisable, false));

    addSystemMethod(SymbolKind::ClassType, std::make_shared<ClassRandomizeFunction>());
    addSystemMethod(SymbolKind::SequenceType,
                    std::make_shared<SequenceMethod>(KnownSystemName::Triggered, false));
    addSystemMethod(SymbolKind::SequenceType,
                    std::make_shared<SequenceMethod>(KnownSystemName::Matched, true));
}